

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

format_decimal_result<char16_t_*>
fmt::v8::detail::format_decimal<char16_t,unsigned_int>(char16_t *out,uint value,int size)

{
  char16_t *pcVar1;
  bool bVar2;
  char16_t *pcVar3;
  uint uVar4;
  char16_t *pcVar5;
  format_decimal_result<char16_t_*> fVar6;
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if (size < (int)((ulong)value + *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar4 * 8)
                  >> 0x20)) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h"
               ,0x45e,"invalid digit count");
  }
  pcVar1 = out + size;
  pcVar3 = pcVar1;
  pcVar5 = pcVar1;
  uVar4 = value;
  if (99 < value) {
    do {
      pcVar3 = pcVar5 + -2;
      uVar4 = value / 100;
      pcVar5[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(ulong)(value % 100) * 2];
      pcVar5[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(ulong)(value % 100) * 2 + 1];
      bVar2 = 9999 < value;
      pcVar5 = pcVar3;
      value = value / 100;
    } while (bVar2);
  }
  if (uVar4 < 10) {
    pcVar3[-1] = (ushort)uVar4 | 0x30;
    pcVar3 = pcVar3 + -1;
  }
  else {
    pcVar3[-2] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(ulong)uVar4 * 2];
    pcVar3[-1] = (short)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(ulong)uVar4 * 2 + 1];
    pcVar3 = pcVar3 + -2;
  }
  fVar6.end = pcVar1;
  fVar6.begin = pcVar3;
  return fVar6;
}

Assistant:

FMT_CONSTEXPR20 auto format_decimal(Char* out, UInt value, int size)
    -> format_decimal_result<Char*> {
  FMT_ASSERT(size >= count_digits(value), "invalid digit count");
  out += size;
  Char* end = out;
  while (value >= 100) {
    // Integer division is slow so do it for a group of two digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    out -= 2;
    copy2(out, digits2(static_cast<size_t>(value % 100)));
    value /= 100;
  }
  if (value < 10) {
    *--out = static_cast<Char>('0' + value);
    return {out, end};
  }
  out -= 2;
  copy2(out, digits2(static_cast<size_t>(value)));
  return {out, end};
}